

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2cAnalyzer.cpp
# Opt level: O0

void __thiscall I2cAnalyzer::SetupResults(I2cAnalyzer *this)

{
  I2cAnalyzerResults *this_00;
  element_type *settings;
  element_type *peVar1;
  I2cAnalyzer *this_local;
  
  this_00 = (I2cAnalyzerResults *)operator_new(0x20);
  settings = std::auto_ptr<I2cAnalyzerSettings>::get(&this->mSettings);
  I2cAnalyzerResults::I2cAnalyzerResults(this_00,this,settings);
  std::auto_ptr<I2cAnalyzerResults>::reset(&this->mResults,this_00);
  std::auto_ptr<I2cAnalyzerResults>::get(&this->mResults);
  Analyzer::SetAnalyzerResults((AnalyzerResults *)this);
  peVar1 = std::auto_ptr<I2cAnalyzerResults>::operator->(&this->mResults);
  std::auto_ptr<I2cAnalyzerSettings>::operator->(&this->mSettings);
  AnalyzerResults::AddChannelBubblesWillAppearOn((Channel *)peVar1);
  return;
}

Assistant:

void I2cAnalyzer::SetupResults()
{
    mResults.reset( new I2cAnalyzerResults( this, mSettings.get() ) );
    SetAnalyzerResults( mResults.get() );
    mResults->AddChannelBubblesWillAppearOn( mSettings->mSdaChannel );
}